

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_endpointer.c
# Opt level: O0

int ep_push(ps_endpointer_t *ep,int is_speech,int16 *frame)

{
  int iVar1;
  int16 *dest;
  int i;
  int16 *frame_local;
  int is_speech_local;
  ps_endpointer_t *ep_local;
  
  iVar1 = (ep->pos + ep->n) % ep->maxlen;
  memcpy(ep->buf + iVar1 * ep->frame_size,frame,(long)ep->frame_size << 1);
  ep->is_speech[iVar1] = (int8)is_speech;
  iVar1 = ep_full(ep);
  if (iVar1 == 0) {
    ep->n = ep->n + 1;
  }
  else {
    ep->qstart_time = ep->frame_length + ep->qstart_time;
    ep->pos = (ep->pos + 1) % ep->maxlen;
  }
  return ep->n;
}

Assistant:

static int
ep_push(ps_endpointer_t *ep, int is_speech, const int16 *frame)
{
    int i = (ep->pos + ep->n) % ep->maxlen;
    int16 *dest = ep->buf + (i * ep->frame_size);
    memcpy(dest, frame, sizeof(*ep->buf) * ep->frame_size);
    ep->is_speech[i] = is_speech;
    if (ep_full(ep)) {
        ep->qstart_time += ep->frame_length;
        ep->pos = (ep->pos + 1) % ep->maxlen;
    }
    else
        ep->n++;
    return ep->n;
}